

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

QSize __thiscall QToolBarAreaLayoutLine::sizeHint(QToolBarAreaLayoutLine *this)

{
  QToolBarAreaLayoutItem *this_00;
  QToolBarAreaLayoutItem *pQVar1;
  QLayoutItem *pQVar2;
  QSize QVar3;
  int iVar4;
  QSize QVar5;
  uint uVar6;
  Representation RVar7;
  long lVar8;
  ulong uVar9;
  uint local_34;
  
  if ((this->toolBarItems).d.size == 0) {
    uVar6 = 0;
    local_34 = 0;
  }
  else {
    lVar8 = 0;
    uVar9 = 0;
    local_34 = 0;
    uVar6 = 0;
    do {
      pQVar1 = (this->toolBarItems).d.ptr;
      this_00 = (QToolBarAreaLayoutItem *)((long)&pQVar1->widgetItem + lVar8);
      RVar7.m_i = uVar6;
      if (((&pQVar1->gap)[lVar8] != false) ||
         ((pQVar2 = this_00->widgetItem, pQVar2 != (QLayoutItem *)0x0 &&
          (iVar4 = (*pQVar2->_vptr_QLayoutItem[8])(), (char)iVar4 == '\0')))) {
        QVar5 = QToolBarAreaLayoutItem::sizeHint(this_00);
        QVar3 = (QSize)((ulong)QVar5 >> 0x20);
        if (this->o == Horizontal) {
          QVar3 = QVar5;
        }
        iVar4 = *(int *)((long)&pQVar1->preferredSize + lVar8);
        RVar7.m_i = QVar3.wd.m_i.m_i;
        if (0 < iVar4) {
          RVar7.m_i = iVar4;
        }
        local_34 = local_34 + RVar7.m_i;
        RVar7 = QVar5.ht.m_i;
        if (this->o == Vertical) {
          RVar7 = QVar5.wd.m_i;
        }
        if (RVar7.m_i < (int)uVar6) {
          RVar7.m_i = uVar6;
        }
      }
      uVar6 = RVar7.m_i;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x18;
    } while (uVar9 < (ulong)(this->toolBarItems).d.size);
  }
  if (this->o == Horizontal) {
    uVar9 = (ulong)uVar6;
  }
  else if (this->o == Vertical) {
    uVar9 = (ulong)local_34;
    local_34 = uVar6;
  }
  else {
    uVar9 = (ulong)uVar6;
    local_34 = 0xffffffff;
  }
  return (QSize)((ulong)local_34 | uVar9 << 0x20);
}

Assistant:

QSize QToolBarAreaLayoutLine::sizeHint() const
{
    int a = 0, b = 0;
    for (int i = 0; i < toolBarItems.size(); ++i) {
        const QToolBarAreaLayoutItem &item = toolBarItems.at(i);
        if (item.skip())
            continue;

        QSize sh = item.sizeHint();
        a += item.preferredSize > 0 ? item.preferredSize : pick(o, sh);
        b = qMax(b, perp(o, sh));
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

    return result;
}